

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::loadGraph(Graph *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *this_00;
  int local_25c;
  int local_258;
  int j;
  int i;
  istream local_248 [8];
  fstream file;
  string local_30 [4];
  int nv;
  string val;
  Graph *this_local;
  
  std::__cxx11::string::string(local_30);
  std::fstream::fstream(local_248,"graph.txt",_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Error while opening the file");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    clearMatrix(this);
    std::operator>>(local_248,local_30);
    iVar3 = std::__cxx11::stoi((string *)local_30,(size_t *)0x0,10);
    this->num_of_vert = iVar3;
    if (iVar3 < 1) {
      std::operator<<((ostream *)&std::cerr,"Graph can\'t have less than 1 vertices");
      exit(1);
    }
    local_258 = 0;
    while (local_258 < iVar3) {
      for (local_25c = 0; local_25c < iVar3; local_25c = local_25c + 1) {
        std::operator>>(local_248,local_30);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"/");
        if (bVar2) {
          local_258 = local_258 + 1;
          local_25c = 0;
          std::__cxx11::string::operator=(local_30,"0");
        }
        iVar4 = std::__cxx11::stoi((string *)local_30,(size_t *)0x0,10);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::stoi((string *)local_30,(size_t *)0x0,10);
          this->adj_matrix[local_258][iVar4 + -1] = this->adj_matrix[local_258][iVar4 + -1] + 1;
        }
      }
    }
    createList(this);
    createPredList(this);
  }
  std::fstream::~fstream(local_248);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Graph::loadGraph(){
   string val; int nv = 0; fstream file("graph.txt", ios::in);
   if(file.good()){
      this->clearMatrix();
      // reads number of vertices (first line)
      file >> val;
      nv = this->num_of_vert = stoi(val);
      if(nv < 1){
         cerr << "Graph can't have less than 1 vertices";
         exit(EXIT_FAILURE);
      }
      for(int i = 0; i < nv;){
         for(int j = 0; j < nv; j++){
            // read the number
            file >> val;
            // if end of number then go to next line(vertex),
            if(val == "/"){
               // set columns to zero, and empty our 'val' variable
               i++;
               j = 0;
               val = "0";
            }
            // if number is good then put '1' in the column which the number is pointing (number - 1, starting from 0)
            if(stoi(val) not_eq 0)
               this->adj_matrix[i][stoi(val) - 1] += 1;
         }
      }
      this->createList();
      this->createPredList();
   }else{
      cout << "Error while opening the file" << endl;
   }
   return void();
}